

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

bool google::protobuf::safe_strto64(string *str,int64 *value)

{
  pointer pcVar1;
  bool bVar2;
  string local_40;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + str->_M_string_length);
  bVar2 = safe_int_internal<long>(&local_40,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

bool safe_strto64(const string& str, int64* value) {
  return safe_int_internal(str, value);
}